

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

size_t derTDec(u32 *tag,octet *der,size_t count)

{
  byte bVar1;
  size_t sVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  
  sVar2 = 0xffffffffffffffff;
  if (count != 0) {
    sVar5 = 4;
    if (count < 4) {
      sVar5 = count;
    }
    bVar1 = *der;
    uVar3 = (uint)bVar1;
    if ((~bVar1 & 0x1f) == 0) {
      if ((count == 1) || (uVar6 = 0, (der[1] & 0x7f) == 0)) {
        return 0;
      }
      sVar2 = 1;
      do {
        sVar4 = sVar2;
        if (sVar5 == sVar4) {
          return 0xffffffffffffffff;
        }
        uVar6 = der[sVar4] & 0x7f | uVar6 << 8;
        sVar2 = sVar4 + 1;
      } while ((char)der[sVar4] < '\0');
      if (sVar5 == sVar2) {
        return 0xffffffffffffffff;
      }
      if (uVar6 < 0x1f) {
        return 0xffffffffffffffff;
      }
      if (tag == (u32 *)0x0) {
        return sVar2;
      }
      sVar5 = 0;
      do {
        uVar3 = (uint)der[sVar5 + 1] | uVar3 << 8;
        sVar5 = sVar5 + 1;
      } while (sVar4 != sVar5);
    }
    else {
      if (bVar1 == 0) {
        return 0xffffffffffffffff;
      }
      if (tag == (u32 *)0x0) {
        return 1;
      }
      sVar2 = 1;
    }
    *tag = uVar3;
  }
  return sVar2;
}

Assistant:

static size_t derTDec(u32* tag, const octet der[], size_t count)
{
	u32 t;
	size_t t_count = 1;
	// обработать длину кода
	if (count < 1)
		return SIZE_MAX;
	ASSERT(memIsValid(der, count));
	count = MIN2(4, count);
	// длинный код?
	if ((der[0] & 31) == 31)
	{
		// короткий код? лишний октет с нулем?
		if (count < 2 || (der[1] & 127) == 0)
			return FALSE;
		for (t = 0; t_count < count;)
		{
			t <<= 8, t |= der[t_count] & 127;
			// завершающий октет?
			if ((der[t_count++] & 128) == 0)
				break;
		}
		// завершающий октет не найден?
		// можно было обойтись коротким кодом?
		if (t_count == count || t < 31)
			return SIZE_MAX;
	}
	// нулевой тег?
	else if (der[0] == 0)
		return SIZE_MAX;
	// возврат 
	if (tag)
	{
		size_t pos;
		ASSERT(memIsValid(tag, 4));
		for (t = der[0], pos = 1; pos < t_count; ++pos)
			t <<= 8, t |= der[pos];
		*tag = t;		
	}
	return t_count;
}